

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Graph * Omega_h::invert_map_by_atomics
                  (Graph *__return_storage_ptr__,LOs *a2b,LO nb,string *b2ba_name,string *ba2a_name)

{
  size_type *psVar1;
  int *piVar2;
  int iVar3;
  undefined8 uVar4;
  size_type sVar5;
  void *pvVar6;
  Graph *this;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  Alloc ***pppAVar10;
  long lVar11;
  Alloc **ppAVar12;
  Alloc *this_00;
  Alloc *pAVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  ScopedTimer omega_h_scoped_function_timer;
  LOs ba2a;
  string __str;
  ScopedTimer omega_h_scoped_function_timer_2;
  type fill;
  LOs b2ba;
  ScopedTimer omega_h_scoped_function_timer_1;
  Write<int> write_ba2a;
  Write<int> degrees;
  type count;
  Write<int> positions;
  ScopedTimer local_1e1;
  undefined1 local_1e0 [32];
  Alloc *local_1c0;
  void *local_1b8;
  Alloc *local_1b0;
  size_type local_1a8;
  Alloc **local_1a0;
  Alloc *local_198;
  Alloc *local_190 [2];
  LO local_180;
  ScopedTimer local_179;
  Alloc ***local_178;
  Alloc **local_170;
  Alloc **local_168;
  long lStack_160;
  Alloc *local_158;
  void *local_150;
  undefined1 local_148 [32];
  Alloc *local_128;
  size_type sStack_120;
  Read<int> local_118;
  Alloc *local_108;
  long local_100;
  undefined1 local_f8 [24];
  undefined1 local_e0 [16];
  void *local_d0;
  Alloc *local_c8;
  Alloc *local_c0;
  Alloc *local_b8;
  void *pvStack_b0;
  LOs local_a8;
  LOs local_98;
  Write<int> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Graph *local_58;
  string *local_50;
  string *local_48;
  Read<signed_char> local_40;
  
  local_180 = nb;
  local_178 = &local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
  pAVar13 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar13) {
    local_148._0_8_ = pAVar13->size;
    local_148._8_8_ = plVar8[3];
    local_158 = (Alloc *)local_148;
  }
  else {
    local_148._0_8_ = pAVar13->size;
    local_158 = (Alloc *)*plVar8;
  }
  local_150 = (void *)plVar8[1];
  *plVar8 = (long)pAVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1a0 = local_190;
  local_48 = b2ba_name;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a0,3,0xf0);
  pAVar13 = (Alloc *)0xf;
  if (local_158 != (Alloc *)local_148) {
    pAVar13 = (Alloc *)local_148._0_8_;
  }
  if (pAVar13 < (Alloc *)((long)local_198 + (long)local_150)) {
    pAVar13 = (Alloc *)0xf;
    if (local_1a0 != local_190) {
      pAVar13 = local_190[0];
    }
    if (pAVar13 < (Alloc *)((long)local_198 + (long)local_150)) goto LAB_002fc1db;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_002fc1db:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0);
  }
  local_1e0._0_8_ = local_1e0 + 0x10;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_1e0._16_8_ = *psVar1;
    local_1e0._24_8_ = puVar9[3];
  }
  else {
    local_1e0._16_8_ = *psVar1;
    local_1e0._0_8_ = (size_type *)*puVar9;
  }
  local_1e0._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(char *)psVar1 = '\0';
  local_50 = ba2a_name;
  begin_code("invert_map_by_atomics",(char *)local_1e0._0_8_);
  plVar8 = (long *)(local_1e0 + 0x10);
  if ((long *)local_1e0._0_8_ != plVar8) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,(ulong)((long)&local_190[0]->size + 1));
  }
  if (local_158 != (Alloc *)local_148) {
    operator_delete(local_158,(ulong)((long)(size_t *)local_148._0_8_ + 1));
  }
  local_58 = __return_storage_ptr__;
  if (local_178 != &local_168) {
    operator_delete(local_178,(long)local_168 + 1);
  }
  pAVar13 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar13 & 1) == 0) {
    sVar16 = pAVar13->size;
  }
  else {
    sVar16 = (ulong)pAVar13 >> 3;
  }
  local_1e0._0_8_ = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  Write<int>::Write((Write<int> *)(local_e0 + 8),local_180,0,(string *)local_1e0);
  if ((long *)local_1e0._0_8_ != plVar8) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  local_c8 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_c0 = (Alloc *)(a2b->write_).shared_alloc_.direct_ptr;
  local_b8 = (Alloc *)local_e0._8_8_;
  if ((local_e0._8_8_ & 7) == 0 && (Alloc *)local_e0._8_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(*(long *)local_e0._8_8_ * 8 + 1);
    }
    else {
      *(int *)(local_e0._8_8_ + 0x30) = *(int *)(local_e0._8_8_ + 0x30) + 1;
    }
  }
  pvStack_b0 = local_d0;
  local_1a0 = (Alloc **)0x5d;
  local_178 = &local_168;
  pppAVar10 = (Alloc ***)std::__cxx11::string::_M_create((ulong *)&local_178,(ulong)&local_1a0);
  ppAVar12 = local_1a0;
  local_168 = local_1a0;
  local_178 = pppAVar10;
  memcpy(pppAVar10,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_170 = ppAVar12;
  *(undefined1 *)((long)pppAVar10 + (long)ppAVar12) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
  pAVar13 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar13) {
    local_148._0_8_ = pAVar13->size;
    local_148._8_8_ = plVar8[3];
    local_158 = (Alloc *)local_148;
  }
  else {
    local_148._0_8_ = pAVar13->size;
    local_158 = (Alloc *)*plVar8;
  }
  local_150 = (void *)plVar8[1];
  *plVar8 = (long)pAVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x02');
  *(undefined2 *)local_1a0 = 0x3438;
  pAVar13 = (Alloc *)0xf;
  if (local_158 != (Alloc *)local_148) {
    pAVar13 = (Alloc *)local_148._0_8_;
  }
  if (pAVar13 < (Alloc *)((long)local_198 + (long)local_150)) {
    pAVar13 = (Alloc *)0xf;
    if (local_1a0 != local_190) {
      pAVar13 = local_190[0];
    }
    if (pAVar13 < (Alloc *)((long)local_198 + (long)local_150)) goto LAB_002fc4e6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_002fc4e6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0);
  }
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_1e0._16_8_ = *psVar1;
    local_1e0._24_8_ = puVar9[3];
    local_1e0._0_8_ = local_1e0 + 0x10;
  }
  else {
    local_1e0._16_8_ = *psVar1;
    local_1e0._0_8_ = (size_type *)*puVar9;
  }
  local_1e0._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("parallel_for",(char *)local_1e0._0_8_);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,(ulong)((long)&local_190[0]->size + 1));
  }
  if (local_158 != (Alloc *)local_148) {
    operator_delete(local_158,(ulong)((long)(size_t *)local_148._0_8_ + 1));
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,(long)local_168 + 1);
  }
  pvVar6 = pvStack_b0;
  iVar15 = (int)(sVar16 >> 2);
  if (0 < iVar15) {
    pAVar13 = local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      pAVar13 = (Alloc *)(local_c8->size * 8 + 1);
    }
    this_00 = local_b8;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      this_00 = (Alloc *)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    pvStack_b0 = (void *)0x0;
    entering_parallel = '\0';
    lVar11 = 0;
    do {
      piVar2 = (int *)((long)pvVar6 + (long)*(int *)((long)&local_c0->size + lVar11 * 4) * 4);
      *piVar2 = *piVar2 + 1;
      lVar11 = lVar11 + 1;
    } while (iVar15 != (int)lVar11);
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar2 = &this_00->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
      piVar2 = &pAVar13->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar13);
        operator_delete(pAVar13,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer((ScopedTimer *)&local_108);
  local_68.shared_alloc_.alloc = (Alloc *)local_e0._8_8_;
  if ((local_e0._8_8_ & 7) == 0 && (Alloc *)local_e0._8_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.shared_alloc_.alloc = (Alloc *)(*(long *)local_e0._8_8_ * 8 + 1);
    }
    else {
      *(int *)(local_e0._8_8_ + 0x30) = *(int *)(local_e0._8_8_ + 0x30) + 1;
    }
  }
  local_68.shared_alloc_.direct_ptr = local_d0;
  Read<int>::Read(&local_40,&local_68);
  offset_scan<int>((Omega_h *)&local_118,(Read<int> *)&local_40,local_48);
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar13 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  iVar7 = Read<int>::get(&local_118,local_180);
  Write<int>::Write((Write<int> *)(local_f8 + 0x10),iVar7,local_50);
  local_1e0._0_8_ = local_1e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  Write<int>::Write(&local_78,local_180,0,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  local_158 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(local_158->size * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_150 = (a2b->write_).shared_alloc_.direct_ptr;
  local_148._0_8_ = local_118.write_.shared_alloc_.alloc;
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148._0_8_ = (local_118.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_118.write_.shared_alloc_.alloc)->use_count =
           (local_118.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_148._8_8_ = local_118.write_.shared_alloc_.direct_ptr;
  local_148._16_8_ = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_148._16_8_ = (local_78.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_148._24_8_ = local_78.shared_alloc_.direct_ptr;
  local_128 = (Alloc *)local_f8._16_8_;
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(*(size_t *)local_f8._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_f8._16_8_ + 0x30) = *(int *)(local_f8._16_8_ + 0x30) + 1;
    }
  }
  sStack_120 = local_e0._0_8_;
  local_108 = (Alloc *)0x5d;
  local_1a0 = local_190;
  ppAVar12 = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_108);
  pAVar13 = local_108;
  local_190[0] = local_108;
  local_1a0 = ppAVar12;
  memcpy(ppAVar12,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_198 = pAVar13;
  *(undefined1 *)((long)ppAVar12 + (long)pAVar13) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  pppAVar10 = (Alloc ***)(plVar8 + 2);
  if ((Alloc ***)*plVar8 == pppAVar10) {
    local_168 = *pppAVar10;
    lStack_160 = plVar8[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *pppAVar10;
    local_178 = (Alloc ***)*plVar8;
  }
  local_170 = (Alloc **)plVar8[1];
  *plVar8 = (long)pppAVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_108 = (Alloc *)local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\x02');
  *(undefined2 *)&local_108->size = 0x3438;
  ppAVar12 = (Alloc **)0xf;
  if (local_178 != &local_168) {
    ppAVar12 = local_168;
  }
  if (ppAVar12 < (Alloc **)(local_100 + (long)local_170)) {
    ppAVar12 = (Alloc **)0xf;
    if (local_108 != (Alloc *)local_f8) {
      ppAVar12 = (Alloc **)local_f8._0_8_;
    }
    if ((Alloc **)(local_100 + (long)local_170) <= ppAVar12) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_178);
      goto LAB_002fcaa7;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_108);
LAB_002fcaa7:
  local_1e0._0_8_ = local_1e0 + 0x10;
  pAVar13 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar13) {
    local_1e0._16_8_ = pAVar13->size;
    local_1e0._24_8_ = plVar8[3];
  }
  else {
    local_1e0._16_8_ = pAVar13->size;
    local_1e0._0_8_ = (Alloc *)*plVar8;
  }
  local_1e0._8_8_ = plVar8[1];
  *plVar8 = (long)pAVar13;
  plVar8[1] = 0;
  *(undefined1 *)&pAVar13->size = 0;
  begin_code("parallel_for",(char *)local_1e0._0_8_);
  if ((Alloc *)local_1e0._0_8_ != (Alloc *)(local_1e0 + 0x10)) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
  }
  if (local_108 != (Alloc *)local_f8) {
    operator_delete(local_108,local_f8._0_8_ + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,(long)local_168 + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,(ulong)((long)&local_190[0]->size + 1));
  }
  sVar5 = sStack_120;
  if (0 < iVar15) {
    local_1e0._0_8_ = local_158;
    if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
      local_1e0._0_8_ = local_158->size * 8 + 1;
    }
    local_1e0._8_8_ = local_150;
    local_1e0._16_8_ = local_148._0_8_;
    if ((local_148._0_8_ & 7) == 0 && (Alloc *)local_148._0_8_ != (Alloc *)0x0) {
      local_1e0._16_8_ = *(size_t *)local_148._0_8_ * 8 + 1;
    }
    local_1e0._24_8_ = local_148._8_8_;
    local_1c0 = (Alloc *)local_148._16_8_;
    if ((local_148._16_8_ & 7) == 0 && (Alloc *)local_148._16_8_ != (Alloc *)0x0) {
      local_1c0 = (Alloc *)(*(size_t *)local_148._16_8_ * 8 + 1);
    }
    local_1b8 = (void *)local_148._24_8_;
    local_1b0 = local_128;
    local_1a8 = sStack_120;
    if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
      local_128->use_count = local_128->use_count + -1;
      local_1b0 = (Alloc *)(local_128->size * 8 + 1);
    }
    local_128 = (Alloc *)0x0;
    sStack_120 = 0;
    entering_parallel = '\0';
    lVar11 = 0;
    do {
      lVar14 = (long)*(int *)((long)local_150 + lVar11 * 4);
      iVar7 = *(int *)(local_148._8_8_ + lVar14 * 4);
      iVar3 = *(int *)(local_148._24_8_ + lVar14 * 4);
      *(int *)(local_148._24_8_ + lVar14 * 4) = iVar3 + 1;
      *(int *)(sVar5 + ((long)iVar7 + (long)iVar3) * 4) = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar15 != (int)lVar11);
    invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_1::~__1((__1 *)local_1e0);
  }
  ScopedTimer::~ScopedTimer(&local_179);
  this = local_58;
  local_88.shared_alloc_.alloc = (Alloc *)local_f8._16_8_;
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_f8._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_f8._16_8_ + 0x30) = *(int *)(local_f8._16_8_ + 0x30) + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = (void *)local_e0._0_8_;
  Read<int>::Read((Read<signed_char> *)local_1e0,&local_88);
  pAVar13 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  local_a8.write_.shared_alloc_.alloc = local_118.write_.shared_alloc_.alloc;
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.write_.shared_alloc_.alloc)->use_count =
           (local_118.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = local_118.write_.shared_alloc_.direct_ptr;
  local_98.write_.shared_alloc_.alloc = (Alloc *)local_1e0._0_8_;
  if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1e0._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_1e0._0_8_ + 0x30) = *(int *)(local_1e0._0_8_ + 0x30) + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (void *)local_1e0._8_8_;
  Graph::Graph(this,&local_a8,&local_98);
  pAVar13 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar13);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  uVar4 = local_1e0._0_8_;
  if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_1e0._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_1e0._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_1::~__1((__1 *)&local_158);
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(local_78.shared_alloc_.alloc,0x48);
    }
  }
  if ((local_f8._16_8_ & 7) == 0 && (Alloc *)local_f8._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_f8._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_f8._16_8_);
      operator_delete((void *)local_f8._16_8_,0x48);
    }
  }
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_118.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
      operator_delete(local_118.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar13 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar2 = &local_b8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    piVar2 = &local_c8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c8);
      operator_delete(pAVar13,0x48);
    }
  }
  if ((local_e0._8_8_ & 7) == 0 && (Alloc *)local_e0._8_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_e0._8_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_e0._8_8_);
      operator_delete((void *)local_e0._8_8_,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1e1);
  return this;
}

Assistant:

Graph invert_map_by_atomics(LOs const a2b, LO const nb,
    std::string const& b2ba_name, std::string const& ba2a_name) {
  OMEGA_H_TIME_FUNCTION;
  auto const na = a2b.size();
  Write<LO> degrees(nb, 0);
  auto count = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    atomic_increment(&degrees[b]);
  };
  parallel_for(na, std::move(count));
  auto const b2ba = offset_scan(Read<LO>(degrees), b2ba_name);
  auto const nba = b2ba.get(nb);
  Write<LO> write_ba2a(nba, ba2a_name);
  auto const positions = Write<LO>(nb, 0);
  auto fill = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    auto const first = b2ba[b];
    auto const j = atomic_fetch_add(&positions[b], 1);
    write_ba2a[first + j] = a;
  };
  parallel_for(na, std::move(fill));
  auto const ba2a = LOs(write_ba2a);
  return Graph(b2ba, ba2a);
}